

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_utxoutil.cpp
# Opt level: O0

void __thiscall UtxoUtil_ConvertToUtxo_Test::TestBody(UtxoUtil_ConvertToUtxo_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uchar *__s2;
  char *pcVar4;
  char *rhs;
  char *in_R9;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  UtxoData dest;
  Utxo utxo;
  UtxoData utxo1;
  bool *in_stack_fffffffffffff318;
  AssertionResult *in_stack_fffffffffffff320;
  undefined7 in_stack_fffffffffffff328;
  undefined1 in_stack_fffffffffffff32f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff330;
  undefined7 in_stack_fffffffffffff338;
  undefined1 in_stack_fffffffffffff33f;
  AssertHelper local_c78;
  Message local_c70;
  AssertionResult local_c68;
  AssertHelper local_c58;
  Message local_c50 [4];
  string local_c30 [56];
  string local_bf8 [32];
  AssertionResult local_bd8;
  AssertHelper local_bc8;
  Message local_bc0;
  AssertionResult local_bb8;
  string local_ba8;
  AssertHelper local_b88;
  Message local_b80 [7];
  undefined1 local_b41;
  AssertionResult local_b40;
  AssertHelper local_b30;
  Message local_b28 [2];
  UtxoData local_b18 [1264];
  Utxo local_628;
  allocator local_539;
  string local_538 [32];
  Txid local_518;
  UtxoData local_4f8 [40];
  Txid local_4d0;
  undefined4 local_4b0;
  undefined4 local_290;
  
  cfd::UtxoData::UtxoData(local_4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_538,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",&local_539
            );
  cfd::core::Txid::Txid(&local_518,local_538);
  cfd::core::Txid::operator=(&local_4d0,&local_518);
  cfd::core::Txid::~Txid((Txid *)0x245174);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  local_4b0 = 1;
  local_290 = 4;
  local_628.fee = 0;
  local_628.long_term_fee = 0;
  local_628.binary_data = (void *)0x0;
  local_628.effective_value = 0;
  local_628.asset[0x17] = '\0';
  local_628.asset[0x18] = '\0';
  local_628.asset[0x19] = '\0';
  local_628.asset[0x1a] = '\0';
  local_628.asset[0x1b] = '\0';
  local_628.asset[0x1c] = '\0';
  local_628.asset[0x1d] = '\0';
  local_628.asset[0x1e] = '\0';
  local_628.asset[0x1f] = '\0';
  local_628.asset[0x20] = '\0';
  local_628._170_6_ = 0;
  local_628.asset[7] = '\0';
  local_628.asset[8] = '\0';
  local_628.asset[9] = '\0';
  local_628.asset[10] = '\0';
  local_628.asset[0xb] = '\0';
  local_628.asset[0xc] = '\0';
  local_628.asset[0xd] = '\0';
  local_628.asset[0xe] = '\0';
  local_628.asset[0xf] = '\0';
  local_628.asset[0x10] = '\0';
  local_628.asset[0x11] = '\0';
  local_628.asset[0x12] = '\0';
  local_628.asset[0x13] = '\0';
  local_628.asset[0x14] = '\0';
  local_628.asset[0x15] = '\0';
  local_628.asset[0x16] = '\0';
  local_628.amount = 0;
  local_628.blinded = false;
  local_628.asset[0] = '\0';
  local_628.asset[1] = '\0';
  local_628.asset[2] = '\0';
  local_628.asset[3] = '\0';
  local_628.asset[4] = '\0';
  local_628.asset[5] = '\0';
  local_628.asset[6] = '\0';
  local_628.locking_script[0x24] = '\0';
  local_628.locking_script[0x25] = '\0';
  local_628.locking_script[0x26] = '\0';
  local_628.locking_script[0x27] = '\0';
  local_628.script_length = 0;
  local_628.address_type = 0;
  local_628.witness_size_max = 0;
  local_628.uscript_size_max = 0;
  local_628._124_4_ = 0;
  local_628.locking_script[0x14] = '\0';
  local_628.locking_script[0x15] = '\0';
  local_628.locking_script[0x16] = '\0';
  local_628.locking_script[0x17] = '\0';
  local_628.locking_script[0x18] = '\0';
  local_628.locking_script[0x19] = '\0';
  local_628.locking_script[0x1a] = '\0';
  local_628.locking_script[0x1b] = '\0';
  local_628.locking_script[0x1c] = '\0';
  local_628.locking_script[0x1d] = '\0';
  local_628.locking_script[0x1e] = '\0';
  local_628.locking_script[0x1f] = '\0';
  local_628.locking_script[0x20] = '\0';
  local_628.locking_script[0x21] = '\0';
  local_628.locking_script[0x22] = '\0';
  local_628.locking_script[0x23] = '\0';
  local_628.locking_script[4] = '\0';
  local_628.locking_script[5] = '\0';
  local_628.locking_script[6] = '\0';
  local_628.locking_script[7] = '\0';
  local_628.locking_script[8] = '\0';
  local_628.locking_script[9] = '\0';
  local_628.locking_script[10] = '\0';
  local_628.locking_script[0xb] = '\0';
  local_628.locking_script[0xc] = '\0';
  local_628.locking_script[0xd] = '\0';
  local_628.locking_script[0xe] = '\0';
  local_628.locking_script[0xf] = '\0';
  local_628.locking_script[0x10] = '\0';
  local_628.locking_script[0x11] = '\0';
  local_628.locking_script[0x12] = '\0';
  local_628.locking_script[0x13] = '\0';
  local_628.txid[0x18] = '\0';
  local_628.txid[0x19] = '\0';
  local_628.txid[0x1a] = '\0';
  local_628.txid[0x1b] = '\0';
  local_628.txid[0x1c] = '\0';
  local_628.txid[0x1d] = '\0';
  local_628.txid[0x1e] = '\0';
  local_628.txid[0x1f] = '\0';
  local_628.vout = 0;
  local_628.locking_script[0] = '\0';
  local_628.locking_script[1] = '\0';
  local_628.locking_script[2] = '\0';
  local_628.locking_script[3] = '\0';
  local_628.txid[8] = '\0';
  local_628.txid[9] = '\0';
  local_628.txid[10] = '\0';
  local_628.txid[0xb] = '\0';
  local_628.txid[0xc] = '\0';
  local_628.txid[0xd] = '\0';
  local_628.txid[0xe] = '\0';
  local_628.txid[0xf] = '\0';
  local_628.txid[0x10] = '\0';
  local_628.txid[0x11] = '\0';
  local_628.txid[0x12] = '\0';
  local_628.txid[0x13] = '\0';
  local_628.txid[0x14] = '\0';
  local_628.txid[0x15] = '\0';
  local_628.txid[0x16] = '\0';
  local_628.txid[0x17] = '\0';
  local_628.block_hash[0x18] = '\0';
  local_628.block_hash[0x19] = '\0';
  local_628.block_hash[0x1a] = '\0';
  local_628.block_hash[0x1b] = '\0';
  local_628.block_hash[0x1c] = '\0';
  local_628.block_hash[0x1d] = '\0';
  local_628.block_hash[0x1e] = '\0';
  local_628.block_hash[0x1f] = '\0';
  local_628.txid[0] = '\0';
  local_628.txid[1] = '\0';
  local_628.txid[2] = '\0';
  local_628.txid[3] = '\0';
  local_628.txid[4] = '\0';
  local_628.txid[5] = '\0';
  local_628.txid[6] = '\0';
  local_628.txid[7] = '\0';
  local_628.block_hash[8] = '\0';
  local_628.block_hash[9] = '\0';
  local_628.block_hash[10] = '\0';
  local_628.block_hash[0xb] = '\0';
  local_628.block_hash[0xc] = '\0';
  local_628.block_hash[0xd] = '\0';
  local_628.block_hash[0xe] = '\0';
  local_628.block_hash[0xf] = '\0';
  local_628.block_hash[0x10] = '\0';
  local_628.block_hash[0x11] = '\0';
  local_628.block_hash[0x12] = '\0';
  local_628.block_hash[0x13] = '\0';
  local_628.block_hash[0x14] = '\0';
  local_628.block_hash[0x15] = '\0';
  local_628.block_hash[0x16] = '\0';
  local_628.block_hash[0x17] = '\0';
  local_628.block_height = 0;
  local_628.block_hash[0] = '\0';
  local_628.block_hash[1] = '\0';
  local_628.block_hash[2] = '\0';
  local_628.block_hash[3] = '\0';
  local_628.block_hash[4] = '\0';
  local_628.block_hash[5] = '\0';
  local_628.block_hash[6] = '\0';
  local_628.block_hash[7] = '\0';
  local_628.effective_k_value = 0;
  cfd::UtxoData::UtxoData(local_b18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::UtxoUtil::ConvertToUtxo(local_4f8,&local_628,local_b18);
    }
  }
  else {
    testing::Message::Message(local_b28);
    testing::internal::AssertHelper::AssertHelper
              (&local_b30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x37,
               "Expected: (UtxoUtil::ConvertToUtxo(utxo1, &utxo, &dest)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b30,local_b28);
    testing::internal::AssertHelper::~AssertHelper(&local_b30);
    testing::Message::~Message((Message *)0x2453c6);
  }
  cfd::core::Txid::GetData();
  cfd::core::ByteData::GetBytes();
  __s2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x245459);
  iVar3 = memcmp(local_628.txid,__s2,0x20);
  local_b41 = iVar3 == 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff320,in_stack_fffffffffffff318,(type *)0x24548e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffff330);
  cfd::core::ByteData::~ByteData((ByteData *)0x2454aa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b40);
  if (!bVar1) {
    testing::Message::Message(local_b80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ba8,(internal *)&local_b40,
               (AssertionResult *)
               "(memcmp(utxo.txid, utxo1.txid.GetData().GetBytes().data(), sizeof(utxo.txid)) == 0)"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x38,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b88,local_b80);
    testing::internal::AssertHelper::~AssertHelper(&local_b88);
    std::__cxx11::string::~string((string *)&local_ba8);
    testing::Message::~Message((Message *)0x2455d7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24564f);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffff33f,in_stack_fffffffffffff338),
             (char *)in_stack_fffffffffffff330,
             (uint *)CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (uint *)in_stack_fffffffffffff320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bb8);
  if (!bVar1) {
    testing::Message::Message(&local_bc0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x2456e5);
    testing::internal::AssertHelper::AssertHelper
              (&local_bc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x39,pcVar4);
    testing::internal::AssertHelper::operator=(&local_bc8,&local_bc0);
    testing::internal::AssertHelper::~AssertHelper(&local_bc8);
    testing::Message::~Message((Message *)0x245742);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x24579a);
  cfd::core::Txid::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_bd8,"dest.txid.GetData().GetHex().c_str()",
             "utxo1.txid.GetData().GetHex().c_str()",pcVar4,rhs);
  std::__cxx11::string::~string(local_c30);
  cfd::core::ByteData::~ByteData((ByteData *)0x245854);
  std::__cxx11::string::~string(local_bf8);
  cfd::core::ByteData::~ByteData((ByteData *)0x24586e);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_bd8);
  if (!(bool)uVar2) {
    testing::Message::Message(local_c50);
    in_stack_fffffffffffff330 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x245969);
    testing::internal::AssertHelper::AssertHelper
              (&local_c58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x3b,(char *)in_stack_fffffffffffff330);
    testing::internal::AssertHelper::operator=(&local_c58,local_c50);
    testing::internal::AssertHelper::~AssertHelper(&local_c58);
    testing::Message::~Message((Message *)0x2459c6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x245a1b);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(uVar2,in_stack_fffffffffffff338),(char *)in_stack_fffffffffffff330,
             (uint *)CONCAT17(in_stack_fffffffffffff32f,in_stack_fffffffffffff328),
             (uint *)in_stack_fffffffffffff320);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c68);
  if (!bVar1) {
    testing::Message::Message(&local_c70);
    in_stack_fffffffffffff320 =
         (AssertionResult *)testing::AssertionResult::failure_message((AssertionResult *)0x245aae);
    testing::internal::AssertHelper::AssertHelper
              (&local_c78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_utxoutil.cpp"
               ,0x3c,(char *)in_stack_fffffffffffff320);
    testing::internal::AssertHelper::operator=(&local_c78,&local_c70);
    testing::internal::AssertHelper::~AssertHelper(&local_c78);
    testing::Message::~Message((Message *)0x245afc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x245b4b);
  cfd::UtxoData::~UtxoData((UtxoData *)in_stack_fffffffffffff320);
  cfd::UtxoData::~UtxoData((UtxoData *)in_stack_fffffffffffff320);
  return;
}

Assistant:

TEST(UtxoUtil, ConvertToUtxo)
{
  UtxoData utxo1;
  utxo1.txid = Txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
  utxo1.vout = 1;
  utxo1.address_type = AddressType::kP2wpkhAddress;

  Utxo utxo;
  memset(&utxo, 0, sizeof(utxo));
  UtxoData dest;

  EXPECT_NO_THROW((UtxoUtil::ConvertToUtxo(utxo1, &utxo, &dest)));
  EXPECT_TRUE((memcmp(utxo.txid, utxo1.txid.GetData().GetBytes().data(), sizeof(utxo.txid)) == 0));
  EXPECT_EQ(utxo.vout, utxo1.vout);
  EXPECT_STREQ(dest.txid.GetData().GetHex().c_str(),
               utxo1.txid.GetData().GetHex().c_str());
  EXPECT_EQ(dest.vout, utxo1.vout);
}